

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

void __thiscall
slang::parsing::Lexer::splitTokens
          (Lexer *this,BumpAllocator *alloc,Diagnostics *diagnostics,SourceManager *sourceManager,
          Token sourceToken,size_t offset,KeywordVersion keywordVersion,
          SmallVectorBase<slang::parsing::Token> *results)

{
  bool bVar1;
  SourceLocation location;
  SourceLocation SVar2;
  BufferID buffer;
  Info *pIVar3;
  string_view sVar4;
  string_view sVar5;
  undefined7 in_stack_00000011;
  Token token;
  Token sourceToken_local;
  Lexer lexer;
  
  pIVar3 = sourceToken.info;
  sourceToken_local.info = sourceToken._0_8_;
  sourceToken_local._0_8_ = sourceManager;
  location = Token::location(&sourceToken_local);
  bVar1 = SourceManager::isMacroLoc((SourceManager *)diagnostics,location);
  if (bVar1) {
    location = SourceManager::getOriginalLoc((SourceManager *)diagnostics,location);
  }
  buffer.id = location._0_4_ & 0xfffffff;
  sVar4 = SourceManager::getSourceText((SourceManager *)diagnostics,buffer);
  if (sVar4._M_len == 0) {
    assert::assertFailed
              ("!sourceText.empty()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/parsing/Lexer.cpp"
               ,0xb4,
               "static void slang::parsing::Lexer::splitTokens(BumpAllocator &, Diagnostics &, const SourceManager &, Token, size_t, KeywordVersion, SmallVectorBase<Token> &)"
              );
  }
  sVar5 = Token::rawText(&sourceToken_local);
  if ((Info *)sVar5._M_len < pIVar3) {
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",pIVar3
               ,(Info *)sVar5._M_len);
  }
  Lexer(&lexer,buffer,sVar4,sVar5._M_str + (long)pIVar3,(BumpAllocator *)this,(Diagnostics *)alloc,
        (LexerOptions)0x10);
  sVar4 = Token::rawText(&sourceToken_local);
  while( true ) {
    token = lex(&lexer,(KeywordVersion)offset);
    if (token.kind == EndOfFile) break;
    SVar2 = Token::location(&token);
    if ((SVar2._0_4_ & 0xfffffff) != buffer.id) break;
    SVar2 = Token::location(&token);
    if (sVar4._M_len + ((ulong)location >> 0x1c) <= (ulong)SVar2 >> 0x1c) break;
    SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
              ((SmallVectorBase<slang::parsing::Token> *)CONCAT71(in_stack_00000011,keywordVersion),
               &token);
  }
  if (lexer.stringBuffer.super_SmallVectorBase<char>.data_ !=
      lexer.stringBuffer.super_SmallVectorBase<char>.firstElement) {
    free(lexer.stringBuffer.super_SmallVectorBase<char>.data_);
  }
  if (lexer.triviaBuffer.super_SmallVectorBase<slang::parsing::Trivia>.data_ !=
      (pointer)lexer.triviaBuffer.super_SmallVectorBase<slang::parsing::Trivia>.firstElement) {
    free(lexer.triviaBuffer.super_SmallVectorBase<slang::parsing::Trivia>.data_);
  }
  return;
}

Assistant:

void Lexer::splitTokens(BumpAllocator& alloc, Diagnostics& diagnostics,
                        const SourceManager& sourceManager, Token sourceToken, size_t offset,
                        KeywordVersion keywordVersion, SmallVectorBase<Token>& results) {
    auto loc = sourceToken.location();
    if (sourceManager.isMacroLoc(loc))
        loc = sourceManager.getOriginalLoc(loc);

    auto sourceText = sourceManager.getSourceText(loc.buffer());
    ASSERT(!sourceText.empty());

    Lexer lexer{loc.buffer(), sourceText,  sourceToken.rawText().substr(offset).data(),
                alloc,        diagnostics, LexerOptions{}};

    size_t endOffset = loc.offset() + sourceToken.rawText().length();
    while (true) {
        Token token = lexer.lex(keywordVersion);
        if (token.kind == TokenKind::EndOfFile || token.location().buffer() != loc.buffer() ||
            token.location().offset() >= endOffset)
            break;

        results.push_back(token);
    }
}